

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O1

char * acopy_string(char **dst,json_value *value)

{
  char *__dest;
  ulong __size;
  
  __size = (ulong)((value->u).boolean + 1);
  __dest = (char *)malloc(__size);
  if (__dest == (char *)0x0) {
    _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cfg.c",0xc9,
               "acopy_string",0,3,"Out of memory!");
  }
  else {
    memcpy(__dest,(value->u).string.ptr,__size);
    *dst = __dest;
  }
  return __dest;
}

Assistant:

static char * acopy_string(char **dst, json_value *value)
{
    char * str = malloc(value->u.string.length+1);
    if (str) {
        memcpy(str, value->u.string.ptr, value->u.string.length+1);
        *dst = str;
    }
    else {
        log_error(LOG_ERR, "Out of memory!");
    }
    return str;
}